

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

void __thiscall VW::config::base_option::~base_option(base_option *this)

{
  ~base_option(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~base_option() {}